

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infoclr_change_fg(Pixell fg)

{
  infoclr *iclr;
  Pixell fg_local;
  
  if (Metadpy->zg < fg) {
    fg_local._4_4_ = -1;
  }
  else {
    XSetForeground(Metadpy->dpy,Infoclr->gc,fg);
    fg_local._4_4_ = 0;
  }
  return fg_local._4_4_;
}

Assistant:

static errr Infoclr_change_fg(Pixell fg)
{
	infoclr *iclr = Infoclr;


	/*** Simple error checking of opr and clr ***/

	/* Check the 'Pixells' for realism */
	if (fg > Metadpy->zg) return (-1);

	/*** Change ***/

	/* Change */
	XSetForeground(Metadpy->dpy, iclr->gc, fg);

	/* Success */
	return (0);
}